

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::RemoveLast(Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  int number;
  CppType CVar2;
  CppStringType CVar3;
  Reflection *pRVar4;
  Descriptor *actual;
  Descriptor *pDVar5;
  ExtensionSet *this_00;
  RepeatedField<long> *this_01;
  RepeatedField<unsigned_int> *this_02;
  RepeatedField<unsigned_long> *this_03;
  RepeatedField<double> *this_04;
  RepeatedField<float> *this_05;
  RepeatedField<bool> *this_06;
  RepeatedField<int> *pRVar6;
  RepeatedField<absl::lts_20250127::Cord> *this_07;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_08;
  MapFieldBase *this_09;
  RepeatedPtrFieldBase *pRVar7;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  pRVar4 = Message::GetReflection(message);
  if (this != pRVar4) {
    pDVar5 = this->descriptor_;
    actual = Message::GetDescriptor(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar5,actual,field,"RemoveLast");
  }
  pDVar5 = FieldDescriptor::containing_type(field);
  if (pDVar5 != this->descriptor_) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"RemoveLast","Field does not match message type.");
  }
  bVar1 = FieldDescriptor::is_repeated(field);
  if (!bVar1) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"RemoveLast",
               "Field is singular; the method requires a repeated field.");
  }
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = MutableExtensionSet(this,message);
    number = FieldDescriptor::number(field);
    internal::ExtensionSet::RemoveLast(this_00,number);
  }
  else {
    CVar2 = FieldDescriptor::cpp_type(field);
    switch(CVar2) {
    case CPPTYPE_INT32:
      pRVar6 = MutableRaw<google::protobuf::RepeatedField<int>>(this,message,field);
      RepeatedField<int>::RemoveLast(pRVar6);
      break;
    case CPPTYPE_INT64:
      this_01 = MutableRaw<google::protobuf::RepeatedField<long>>(this,message,field);
      RepeatedField<long>::RemoveLast(this_01);
      break;
    case CPPTYPE_UINT32:
      this_02 = MutableRaw<google::protobuf::RepeatedField<unsigned_int>>(this,message,field);
      RepeatedField<unsigned_int>::RemoveLast(this_02);
      break;
    case CPPTYPE_UINT64:
      this_03 = MutableRaw<google::protobuf::RepeatedField<unsigned_long>>(this,message,field);
      RepeatedField<unsigned_long>::RemoveLast(this_03);
      break;
    case CPPTYPE_DOUBLE:
      this_04 = MutableRaw<google::protobuf::RepeatedField<double>>(this,message,field);
      RepeatedField<double>::RemoveLast(this_04);
      break;
    case CPPTYPE_FLOAT:
      this_05 = MutableRaw<google::protobuf::RepeatedField<float>>(this,message,field);
      RepeatedField<float>::RemoveLast(this_05);
      break;
    case CPPTYPE_BOOL:
      this_06 = MutableRaw<google::protobuf::RepeatedField<bool>>(this,message,field);
      RepeatedField<bool>::RemoveLast(this_06);
      break;
    case CPPTYPE_ENUM:
      pRVar6 = MutableRaw<google::protobuf::RepeatedField<int>>(this,message,field);
      RepeatedField<int>::RemoveLast(pRVar6);
      break;
    case CPPTYPE_STRING:
      CVar3 = FieldDescriptor::cpp_string_type(field);
      if (CVar3 != kView) {
        if (CVar3 == kCord) {
          this_07 = MutableRaw<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>
                              (this,message,field);
          RepeatedField<absl::lts_20250127::Cord>::RemoveLast(this_07);
          return;
        }
        if (CVar3 != kString) {
          return;
        }
      }
      this_08 = MutableRaw<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                          (this,message,field);
      RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::RemoveLast(this_08);
      break;
    case CPPTYPE_MESSAGE:
      bVar1 = anon_unknown_6::IsMapFieldInApi(field);
      if (bVar1) {
        this_09 = MutableRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
        pRVar7 = internal::MapFieldBase::MutableRepeatedField(this_09);
        internal::RepeatedPtrFieldBase::
        RemoveLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                  (pRVar7);
      }
      else {
        pRVar7 = MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field);
        internal::RepeatedPtrFieldBase::
        RemoveLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                  (pRVar7);
      }
    }
  }
  return;
}

Assistant:

void Reflection::RemoveLast(Message* message,
                            const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE(RemoveLast, message);
  USAGE_CHECK_MESSAGE_TYPE(RemoveLast);
  USAGE_CHECK_REPEATED(RemoveLast);

  if (field->is_extension()) {
    MutableExtensionSet(message)->RemoveLast(field->number());
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:                             \
    MutableRaw<RepeatedField<LOWERCASE> >(message, field)->RemoveLast(); \
    break

      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->cpp_string_type()) {
          case FieldDescriptor::CppStringType::kCord:
            MutableRaw<RepeatedField<absl::Cord>>(message, field)->RemoveLast();
            break;
          case FieldDescriptor::CppStringType::kView:
          case FieldDescriptor::CppStringType::kString:
            MutableRaw<RepeatedPtrField<std::string> >(message, field)
                ->RemoveLast();
            break;
        }
        break;

      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (IsMapFieldInApi(field)) {
          MutableRaw<MapFieldBase>(message, field)
              ->MutableRepeatedField()
              ->RemoveLast<GenericTypeHandler<Message> >();
        } else {
          MutableRaw<RepeatedPtrFieldBase>(message, field)
              ->RemoveLast<GenericTypeHandler<Message> >();
        }
        break;
    }
  }
}